

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

SBarInfoCommand * __thiscall
SBarInfoCommandFlowControl::NextCommand(SBarInfoCommandFlowControl *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  FScanner *sc_local;
  SBarInfoCommandFlowControl *this_local;
  
  bVar1 = FScanner::CheckToken(sc,0x101);
  if (bVar1) {
    iVar2 = FScanner::MatchString(sc,SBarInfoCommandNames,8);
    switch(iVar2) {
    case 0:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x80);
      CommandDrawImage::CommandDrawImage
                ((CommandDrawImage *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 1:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0xa0);
      CommandDrawNumber::CommandDrawNumber
                ((CommandDrawNumber *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 2:
      this_local = (SBarInfoCommandFlowControl *)operator_new(200);
      CommandDrawSwitchableImage::CommandDrawSwitchableImage
                ((CommandDrawSwitchableImage *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 3:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x28);
      CommandDrawMugShot::CommandDrawMugShot
                ((CommandDrawMugShot *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 4:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x128);
      CommandDrawSelectedInventory::CommandDrawSelectedInventory
                ((CommandDrawSelectedInventory *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 5:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x50);
      CommandDrawInventoryBar::CommandDrawInventoryBar
                ((CommandDrawInventoryBar *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 6:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x58);
      CommandDrawBar::CommandDrawBar
                ((CommandDrawBar *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 7:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x40);
      CommandDrawGem::CommandDrawGem
                ((CommandDrawGem *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 8:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x28);
      CommandDrawShader::CommandDrawShader
                ((CommandDrawShader *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 9:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x60);
      CommandDrawString::CommandDrawString
                ((CommandDrawString *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 10:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x30);
      CommandDrawKeyBar::CommandDrawKeyBar
                ((CommandDrawKeyBar *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0xb:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x38);
      CommandGameMode::CommandGameMode
                ((CommandGameMode *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0xc:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x48);
      CommandPlayerClass::CommandPlayerClass
                ((CommandPlayerClass *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0xd:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x48);
      CommandPlayerType::CommandPlayerType
                ((CommandPlayerType *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0xe:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x38);
      CommandAspectRatio::CommandAspectRatio
                ((CommandAspectRatio *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0xf:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x48);
      CommandIsSelected::CommandIsSelected
                ((CommandIsSelected *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x10:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x38);
      CommandUsesAmmo::CommandUsesAmmo
                ((CommandUsesAmmo *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x11:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x38);
      CommandUsesSecondaryAmmo::CommandUsesSecondaryAmmo
                ((CommandUsesSecondaryAmmo *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x12:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x48);
      CommandHasWeaponPiece::CommandHasWeaponPiece
                ((CommandHasWeaponPiece *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x13:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x38);
      CommandInventoryBarNotVisible::CommandInventoryBarNotVisible
                ((CommandInventoryBarNotVisible *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x14:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x50);
      CommandWeaponAmmo::CommandWeaponAmmo
                ((CommandWeaponAmmo *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x15:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x50);
      CommandInInventory::CommandInInventory
                ((CommandInInventory *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x16:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x58);
      CommandAlpha::CommandAlpha((CommandAlpha *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x17:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x40);
      CommandIfHealth::CommandIfHealth
                ((CommandIfHealth *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x18:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x38);
      CommandIfInvulnerable::CommandIfInvulnerable
                ((CommandIfInvulnerable *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x19:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x38);
      CommandIfWaterLevel::CommandIfWaterLevel
                ((CommandIfWaterLevel *)this_local,(this->super_SBarInfoCommand).script);
      break;
    case 0x1a:
      this_local = (SBarInfoCommandFlowControl *)operator_new(0x50);
      CommandIfCVarInt::CommandIfCVarInt
                ((CommandIfCVarInt *)this_local,(this->super_SBarInfoCommand).script);
      break;
    default:
      FScanner::ScriptError(sc,"Unknown command \'%s\'.\n",sc->String);
      this_local = (SBarInfoCommandFlowControl *)0x0;
    }
  }
  else {
    FScanner::MustGetToken(sc,0x7d);
    this_local = (SBarInfoCommandFlowControl *)0x0;
  }
  return &this_local->super_SBarInfoCommand;
}

Assistant:

SBarInfoCommand *SBarInfoCommandFlowControl::NextCommand(FScanner &sc)
{
	if(sc.CheckToken(TK_Identifier))
	{
		switch(sc.MatchString(SBarInfoCommandNames))
		{
			default: break;
			case SBARINFO_DRAWIMAGE: return new CommandDrawImage(script);
			case SBARINFO_DRAWSWITCHABLEIMAGE: return new CommandDrawSwitchableImage(script);
			case SBARINFO_DRAWSTRING: return new CommandDrawString(script);
			case SBARINFO_DRAWNUMBER: return new CommandDrawNumber(script);
			case SBARINFO_DRAWMUGSHOT: return new CommandDrawMugShot(script);
			case SBARINFO_DRAWSELECTEDINVENTORY: return static_cast<SBarInfoCommandFlowControl *> (new CommandDrawSelectedInventory(script));
			case SBARINFO_DRAWSHADER: return new CommandDrawShader(script);
			case SBARINFO_DRAWINVENTORYBAR: return new CommandDrawInventoryBar(script);
			case SBARINFO_DRAWKEYBAR: return new CommandDrawKeyBar(script);
			case SBARINFO_DRAWBAR: return new CommandDrawBar(script);
			case SBARINFO_DRAWGEM: return new CommandDrawGem(script);
			case SBARINFO_GAMEMODE: return new CommandGameMode(script);
			case SBARINFO_USESAMMO: return new CommandUsesAmmo(script);
			case SBARINFO_USESSECONDARYAMMO: return new CommandUsesSecondaryAmmo(script);
			case SBARINFO_INVENTORYBARNOTVISIBLE: return new CommandInventoryBarNotVisible(script);
			case SBARINFO_ASPECTRATIO: return new CommandAspectRatio(script);
			case SBARINFO_ISSELECTED: return new CommandIsSelected(script);
			case SBARINFO_PLAYERCLASS: return new CommandPlayerClass(script);
			case SBARINFO_PLAYERTYPE: return new CommandPlayerType(script);
			case SBARINFO_HASWEAPONPIECE: return new CommandHasWeaponPiece(script);
			case SBARINFO_WEAPONAMMO: return new CommandWeaponAmmo(script);
			case SBARINFO_ININVENTORY: return new CommandInInventory(script);
			case SBARINFO_ALPHA: return new CommandAlpha(script);
			case SBARINFO_IFHEALTH: return new CommandIfHealth(script);
			case SBARINFO_IFINVULNERABLE: return new CommandIfInvulnerable(script);
			case SBARINFO_IFWATERLEVEL: return new CommandIfWaterLevel(script);
			case SBARINFO_IFCVARINT: return new CommandIfCVarInt(script);
		}

		sc.ScriptError("Unknown command '%s'.\n", sc.String);
		return NULL;
	}

	sc.MustGetToken('}');
	return NULL;
}